

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdsCpp.cpp
# Opt level: O2

int gdsRecordToText(char *recIn)

{
  int iVar1;
  uint uVar2;
  ostream *poVar3;
  int iVar4;
  char *pcVar5;
  ostream *poVar6;
  ulong uVar7;
  uint32_t GDSKey;
  vector<double,_std::allocator<double>_> B8Real;
  vector<int,_std::allocator<int>_> integer;
  bitset<8UL> bitsIn1;
  bitset<8UL> bitsIn0;
  string local_d0;
  string keyName;
  string words;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  bitset<16UL> bitarr;
  
  bitarr.super__Base_bitset<1UL>._M_w = (_Base_bitset<1UL>)0;
  integer.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  integer.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  integer.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  B8Real.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  B8Real.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  B8Real.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  words._M_dataplus._M_p = (pointer)&words.field_2;
  words._M_string_length = 0;
  words.field_2._M_local_buf[0] = '\0';
  keyName._M_dataplus._M_p = (pointer)&keyName.field_2;
  keyName._M_string_length = 0;
  keyName.field_2._M_local_buf[0] = '\0';
  iVar1 = GDSdistill(recIn,&GDSKey,&bitarr,&integer,&B8Real,&words);
  iVar4 = 1;
  if (iVar1 == 1) goto LAB_00113495;
  GDSkey2ASCII_abi_cxx11_(&local_d0,GDSKey);
  std::__cxx11::string::operator=((string *)&keyName,(string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  iVar1 = std::__cxx11::string::compare((char *)&keyName);
  if (iVar1 == 0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Key not found: 0x");
    *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
         *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 8;
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
         *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 2;
LAB_00113331:
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  else {
    poVar6 = (ostream *)&std::cout;
    poVar3 = std::operator<<((ostream *)&std::cout,"[");
    poVar3 = std::operator<<(poVar3,(string *)&keyName);
    std::operator<<(poVar3,"]");
    if ((char)GDSKey != '\0') {
      uVar2 = GDSKey & 0xff;
      if (uVar2 == 1) {
        bitsIn0.super__Base_bitset<1UL>._M_w._1_7_ = 0;
        bitsIn0.super__Base_bitset<1UL>._M_w._0_1_ = recIn[4];
        bitsIn1.super__Base_bitset<1UL>._M_w._1_7_ = 0;
        bitsIn1.super__Base_bitset<1UL>._M_w._0_1_ = recIn[5];
        poVar3 = std::operator<<((ostream *)&std::cout,":{");
        poVar3 = std::operator<<(poVar3,"0b");
        std::bitset<8ul>::to_string<char,std::char_traits<char>,std::allocator<char>>
                  (&local_d0,(bitset<8ul> *)&bitsIn0);
        poVar3 = std::operator<<(poVar3,(string *)&local_d0);
        std::bitset<8ul>::to_string<char,std::char_traits<char>,std::allocator<char>>
                  (&local_70,(bitset<8ul> *)&bitsIn1);
        std::operator+(&local_50," 0b",&local_70);
        poVar3 = std::operator<<(poVar3,(string *)&local_50);
        poVar3 = std::operator<<(poVar3,"}");
        std::endl<char,std::char_traits<char>>(poVar3);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_d0);
        iVar4 = 0;
        goto LAB_00113495;
      }
      if ((GDSKey & 0xfe) == 2) {
        poVar3 = (ostream *)&std::cout;
        std::operator<<((ostream *)&std::cout,":{");
        uVar2 = 0;
        while( true ) {
          uVar7 = (ulong)uVar2;
          if ((ulong)((long)integer.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)integer.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start >> 2) <= uVar7) break;
          std::ostream::operator<<
                    (&std::cout,
                     integer.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar7]);
          if (uVar7 < ((long)integer.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)integer.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start >> 2) - 1U) {
            std::operator<<((ostream *)&std::cout,", ");
          }
          uVar2 = uVar2 + 1;
        }
      }
      else {
        if ((char)GDSKey == '\x04') {
          pcVar5 = "Unsupported 4 byte real variable.";
LAB_001134e2:
          poVar3 = std::operator<<((ostream *)&std::cout,pcVar5);
          goto LAB_00113331;
        }
        if (uVar2 == 6) {
          poVar3 = std::operator<<((ostream *)&std::cout,":{");
          poVar3 = std::operator<<(poVar3,(string *)&words);
        }
        else {
          if (uVar2 != 5) {
            pcVar5 = "Smoke detected.";
            goto LAB_001134e2;
          }
          poVar3 = (ostream *)&std::cout;
          std::operator<<((ostream *)&std::cout,":{");
          *(undefined8 *)(operator_delete__ + *(long *)(std::cout + -0x18)) = 0xc;
          uVar2 = 0;
          while( true ) {
            uVar7 = (ulong)uVar2;
            if ((ulong)((long)B8Real.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                        (long)B8Real.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start >> 3) <= uVar7) break;
            std::ostream::_M_insert<double>
                      (B8Real.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar7]);
            if (uVar7 < ((long)B8Real.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                         (long)B8Real.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start >> 3) - 1U) {
              std::operator<<((ostream *)&std::cout,", ");
            }
            uVar2 = uVar2 + 1;
          }
        }
      }
      poVar6 = std::operator<<(poVar3,"}");
    }
    iVar4 = 0;
    std::endl<char,std::char_traits<char>>(poVar6);
  }
LAB_00113495:
  std::__cxx11::string::~string((string *)&keyName);
  std::__cxx11::string::~string((string *)&words);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&B8Real.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&integer.super__Vector_base<int,_std::allocator<int>_>);
  return iVar4;
}

Assistant:

int gdsRecordToText(char *recIn)
{
  uint32_t GDSKey;
  bitset<16> bitarr;
  vector<int> integer;
  vector<double> B8Real;
  string words;
  string keyName;

  uint8_t dataType;

  if (GDSdistill(recIn, GDSKey, bitarr, integer, B8Real, words) == 1) {
    return 1;
  }
  dataType = GDSKey;

  keyName = GDSkey2ASCII(GDSKey);

  if (!keyName.compare("\0")) {
    cout << "Key not found: 0x" << hex << GDSKey << dec << endl;
    return 1;
  }

  cout << "[" << keyName << "]";

  if (dataType == 0) {
    // no data
    cout << endl;
  } else if (dataType == 1) {
    // bit array
    int i = 4;
    bitset<8> bitsIn0(recIn[i++]);
    bitset<8> bitsIn1(recIn[i]);

    cout << ":{"
         << "0b" << bitsIn0.to_string() << " 0b" + bitsIn1.to_string() << "}"
         << endl;
  } else if (dataType == 2 || dataType == 3) {
    // signed integers

    cout << ":{";
    for (unsigned int j = 0; j < integer.size(); j++) {
      cout << integer[j];
      if (j < integer.size() - 1) {
        cout << ", ";
      }
    }
    cout << "}" << endl;
  } else if (dataType == 4) {
    // 4 byte real (NOT USED)
    cout << "Unsupported 4 byte real variable." << endl;
    return 1;
  } else if (dataType == 5) {
    // 8 byte real

    cout << ":{";
    cout.precision(12);
    for (unsigned int j = 0; j < B8Real.size(); j++) {
      cout << B8Real[j];
      if (j < B8Real.size() - 1) {
        cout << ", ";
      }
    }
    cout << "}" << endl;
  } else if (dataType == 6) {
    // ASCII string

    cout << ":{" << words << "}" << endl;
  } else {
    cout << "Smoke detected." << endl;
    return 1;
  }

  return 0;
}